

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer piVar3;
  pointer piVar4;
  uint uVar5;
  result_type rVar6;
  result_type rVar7;
  ostream *poVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  size_t __i;
  long lVar13;
  int iVar14;
  size_t i;
  vector<int,_std::allocator<int>_> ps;
  vector<float,_std::allocator<float>_> ps_results;
  vector<float,_std::allocator<float>_> ref_results;
  vector<int,_std::allocator<int>_> values_ps;
  vector<int,_std::allocator<int>_> values_ref;
  vector<int,_std::allocator<int>_> ref;
  uniform_int_distribution<int> dist_rand;
  uniform_int_distribution<int> dist_value;
  mt19937 mt;
  random_device dev;
  float local_2810;
  float local_280c;
  vector<int,_std::allocator<int>_> local_2808;
  vector<float,_std::allocator<float>_> local_27e8;
  vector<float,_std::allocator<float>_> local_27c8;
  float local_27b0;
  float local_27ac;
  vector<int,_std::allocator<int>_> local_27a8;
  vector<int,_std::allocator<int>_> local_2788;
  vector<int,_std::allocator<int>_> local_2768;
  param_type local_2750;
  param_type local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  std::random_device::random_device(&local_13b8);
  uVar5 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar5;
  lVar13 = 1;
  uVar9 = local_2740._M_x[0];
  do {
    uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar13);
    local_2740._M_x[lVar13] = uVar9;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x270);
  local_2740._M_p = 0x270;
  local_2748._M_a = 0;
  local_2748._M_b = 100000;
  local_2750._M_a = 0;
  local_2750._M_b = 10000000;
  lVar13 = 0;
  do {
    local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,(int)lVar13);
    if (local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_2808,
                 (iterator)
                 local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_27a8);
    }
    else {
      *local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = (int)lVar13;
      local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 10000000);
  lVar13 = 1000000;
  do {
    rVar6 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_2748,&local_2740,&local_2748);
    rVar7 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_2750,&local_2740,&local_2750);
    local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[rVar7] = rVar6;
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  std::vector<int,_std::allocator<int>_>::operator=(&local_2768,&local_2808);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sorting ",8);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10000000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," integers with a size of ",0x19);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  iVar14 = 10;
  do {
    local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (int *)0x0;
    local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::operator=(&local_27a8,&local_2808);
    std::vector<int,_std::allocator<int>_>::operator=(&local_2788,&local_2768);
    lVar13 = std::chrono::_V2::system_clock::now();
    piVar4 = local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar3 = local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar9 = (long)local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      lVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar3,piVar4);
    }
    lVar10 = std::chrono::_V2::system_clock::now();
    PatienceSortFunc<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    lVar11 = std::chrono::_V2::system_clock::now();
    local_2810 = (float)((lVar10 - lVar13) / 1000000);
    if (local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_27c8,
                 (iterator)
                 local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_2810);
    }
    else {
      *local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_2810;
      local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_2810 = (float)((lVar11 - lVar10) / 1000000);
    if (local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_27e8,
                 (iterator)
                 local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_2810);
    }
    else {
      *local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_2810;
      local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    if (local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_27a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pfVar2 = local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar1 = local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  local_27ac = 0.0;
  for (pfVar12 = local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pfVar12 !=
      local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish; pfVar12 = pfVar12 + 1) {
    local_27ac = local_27ac + *pfVar12;
  }
  local_27b0 = 0.0;
  for (pfVar12 = local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pfVar12 !=
      local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish; pfVar12 = pfVar12 + 1) {
    local_27b0 = local_27b0 + *pfVar12;
  }
  local_280c = (float)(ulong)((long)local_27e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_27e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"std::sort:\t",0xb);
  poVar8 = std::ostream::_M_insert<double>
                     ((double)(local_27ac / (float)(ulong)((long)pfVar2 - (long)pfVar1 >> 2)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Patience Sort:\t",0xf);
  poVar8 = std::ostream::_M_insert<double>((double)(local_27b0 / local_280c));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::random_device::_M_fini();
  if (local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_27e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_27c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2768.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2768.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2768.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2808.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {

    const int count = 10000000;
    const int max_value = 100000;
    const float randomness = 0.1f;          // Use 10% random values

    const int rounds = 10;                  // builds the average from 10 cycles
    vector<int> ps, ref;
    vector<float> ref_results, ps_results;
    float ref_result = 0;
    float ps_result = 0;
    int num_randoms;

    std::random_device dev;
    std::mt19937 mt(dev());
    std::uniform_int_distribution<int> dist_value(0, max_value);
    std::uniform_int_distribution<int> dist_rand(0, count);


    num_randoms = count * randomness;
    for(size_t i = 0; i < count; i++) {
        ps.push_back(i);
    }
    for(size_t i = 0; i < num_randoms; i++) {
        ps[dist_rand(mt)] = dist_value(mt);
    }
    ref = ps;

    cout << "Sorting " << count << " integers with a size of " << sizeof(int) << endl;

    for(int i = 0; i < rounds; i++) {
        vector<int> values_ps, values_ref;
        values_ps = ps;
        values_ref = ref;

        auto t0 = std::chrono::high_resolution_clock::now();
        sort(values_ref.begin(), values_ref.end());
        auto t1 = std::chrono::high_resolution_clock::now();
        PatienceSortFunc(values_ps.begin(), values_ps.end());
        auto t2 = std::chrono::high_resolution_clock::now();


        ref_results.push_back(chrono::duration_cast<std::chrono::milliseconds>(t1 - t0).count());
        ps_results.push_back(chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count());

    }

    for_each(ref_results.begin(), ref_results.end(), [&](float f){ref_result += f;});
    for_each(ps_results.begin(), ps_results.end(), [&](float f){ps_result += f;});
    ref_result /= ref_results.size();
    ps_result /= ps_results.size();


    cout << "std::sort:\t" << ref_result << " ms" << endl;
    cout << "Patience Sort:\t" << ps_result << " ms" << endl;


    return 0;
}